

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

cio_error cio_socket_close(cio_socket *socket)

{
  uint64_t timeout_ns;
  int iVar1;
  cio_error cVar2;
  
  if (socket == (cio_socket *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  if (((socket->impl).peer_closed_connection == true) ||
     (timeout_ns = (socket->impl).close_timeout_ns, timeout_ns == 0)) {
    close_socket(socket);
  }
  else {
    iVar1 = shutdown((socket->impl).ev.fd,1);
    if (iVar1 != -1) {
      (socket->impl).ev.context = socket;
      (socket->impl).ev.read_callback = read_until_close_callback;
      cVar2 = cio_timer_expires_from_now
                        (&(socket->impl).close_timer,timeout_ns,close_timeout_handler,socket);
      if ((cVar2 == CIO_SUCCESS) &&
         (cVar2 = cio_linux_eventloop_register_read((socket->impl).loop,&(socket->impl).ev),
         cVar2 == CIO_SUCCESS)) {
        return CIO_SUCCESS;
      }
    }
    reset_connection(socket);
  }
  return CIO_SUCCESS;
}

Assistant:

enum cio_error cio_socket_close(struct cio_socket *socket)
{
	if (cio_unlikely(socket == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (socket->impl.peer_closed_connection) {
		close_socket(socket);
		return CIO_SUCCESS;
	}

	if (socket->impl.close_timeout_ns > 0) {
		shutdown_socket(socket, socket->impl.close_timeout_ns);
		return CIO_SUCCESS;
	}

	close_socket(socket);
	return CIO_SUCCESS;
}